

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

void __thiscall
tlx::CmdlineParser::add_float(CmdlineParser *this,string *longkey,float *dest,string *desc)

{
  allocator local_49;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,"",&local_49);
  add_float(this,'\0',longkey,&local_48,dest,desc);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void CmdlineParser::add_float(const std::string& longkey,
                              float& dest, const std::string& desc) {
    return add_float(0, longkey, "", dest, desc);
}